

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O2

CKey * __thiscall CKey::operator=(CKey *this,CKey *other)

{
  long lVar1;
  array<unsigned_char,_32UL> *paVar2;
  array<unsigned_char,_32UL> *paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this != other) {
    if ((other->keydata)._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
        (array<unsigned_char,_32UL> *)0x0) {
      ClearKeyData(this);
    }
    else {
      MakeKeyData(this);
      paVar2 = (other->keydata)._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
      paVar3 = (this->keydata)._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
      uVar4 = *(undefined8 *)paVar2->_M_elems;
      uVar5 = *(undefined8 *)(paVar2->_M_elems + 8);
      uVar6 = *(undefined8 *)(paVar2->_M_elems + 0x18);
      *(undefined8 *)(paVar3->_M_elems + 0x10) = *(undefined8 *)(paVar2->_M_elems + 0x10);
      *(undefined8 *)(paVar3->_M_elems + 0x18) = uVar6;
      *(undefined8 *)paVar3->_M_elems = uVar4;
      *(undefined8 *)(paVar3->_M_elems + 8) = uVar5;
    }
    this->fCompressed = other->fCompressed;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CKey& operator=(const CKey& other)
    {
        if (this != &other) {
            if (other.keydata) {
                MakeKeyData();
                *keydata = *other.keydata;
            } else {
                ClearKeyData();
            }
            fCompressed = other.fCompressed;
        }
        return *this;
    }